

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.c
# Opt level: O3

int main(void)

{
  int iVar1;
  GLFWwindow *handle;
  double dVar2;
  int height;
  int width;
  int local_30;
  int local_2c;
  undefined1 local_28 [16];
  
  glfwSetErrorCallback(error_callback);
  iVar1 = glfwInit();
  if (iVar1 != 0) {
    handle = glfwCreateWindow(0x280,0x1e0,"Simple example",(GLFWmonitor *)0x0,(GLFWwindow *)0x0);
    if (handle != (GLFWwindow *)0x0) {
      glfwMakeContextCurrent(handle);
      glfwSetKeyCallback(handle,key_callback);
      iVar1 = glfwWindowShouldClose(handle);
      if (iVar1 == 0) {
        do {
          glfwGetFramebufferSize(handle,&local_2c,&local_30);
          local_28 = ZEXT416((uint)((float)local_2c / (float)local_30));
          glViewport(0,0);
          glClear(0x4000);
          glMatrixMode(0x1701);
          glLoadIdentity();
          glOrtho((double)-(float)local_28._0_4_,SUB84((double)(float)local_28._0_4_,0),
                  0xbff0000000000000,0x3ff0000000000000,0,0);
          glMatrixMode(0x1700);
          glLoadIdentity();
          dVar2 = glfwGetTime();
          glRotatef((float)dVar2 * 50.0,0,0,0x3f800000);
          glBegin(4);
          glColor3f(0x3f800000,0,0);
          glVertex3f(0xbf19999a,0xbecccccd,0);
          glColor3f(0,0x3f800000,0);
          glVertex3f(0x3f19999a,0xbecccccd,0);
          glColor3f(0,0,0x3f800000);
          glVertex3f(0,0x3f19999a,0);
          glEnd();
          glfwSwapBuffers(handle);
          glfwPollEvents();
          iVar1 = glfwWindowShouldClose(handle);
        } while (iVar1 == 0);
      }
      glfwDestroyWindow(handle);
      glfwTerminate();
      exit(0);
    }
    glfwTerminate();
  }
  exit(1);
}

Assistant:

int main(void)
{
    GLFWwindow* window;

    glfwSetErrorCallback(error_callback);

    if (!glfwInit())
        exit(EXIT_FAILURE);

    window = glfwCreateWindow(640, 480, "Simple example", NULL, NULL);
    if (!window)
    {
        glfwTerminate();
        exit(EXIT_FAILURE);
    }

    glfwMakeContextCurrent(window);

    glfwSetKeyCallback(window, key_callback);

    while (!glfwWindowShouldClose(window))
    {
        float ratio;
        int width, height;

        glfwGetFramebufferSize(window, &width, &height);
        ratio = width / (float) height;

        glViewport(0, 0, width, height);
        glClear(GL_COLOR_BUFFER_BIT);

        glMatrixMode(GL_PROJECTION);
        glLoadIdentity();
        glOrtho(-ratio, ratio, -1.f, 1.f, 1.f, -1.f);
        glMatrixMode(GL_MODELVIEW);

        glLoadIdentity();
        glRotatef((float) glfwGetTime() * 50.f, 0.f, 0.f, 1.f);

        glBegin(GL_TRIANGLES);
        glColor3f(1.f, 0.f, 0.f);
        glVertex3f(-0.6f, -0.4f, 0.f);
        glColor3f(0.f, 1.f, 0.f);
        glVertex3f(0.6f, -0.4f, 0.f);
        glColor3f(0.f, 0.f, 1.f);
        glVertex3f(0.f, 0.6f, 0.f);
        glEnd();

        glfwSwapBuffers(window);
        glfwPollEvents();
    }

    glfwDestroyWindow(window);

    glfwTerminate();
    exit(EXIT_SUCCESS);
}